

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void change_direction_move(Direction *direction,char input_direction)

{
  ulong uVar1;
  int iVar2;
  undefined7 in_register_00000031;
  
  iVar2 = (int)CONCAT71(in_register_00000031,input_direction);
  if (iVar2 < 0x61) {
    switch(iVar2) {
    case 0x41:
switchD_00103c61_caseD_41:
      *direction = UP;
      uVar1 = (ulong)((int)input_direction - 0x42U);
      if (0x31 < (int)input_direction - 0x42U) {
        return;
      }
      if ((0x80000004UL >> (uVar1 & 0x3f) & 1) == 0) {
        if ((0x400000002U >> (uVar1 & 0x3f) & 1) != 0) goto switchD_00103c61_caseD_43;
        if ((0x2000000000001U >> (uVar1 & 0x3f) & 1) == 0) {
          return;
        }
        goto switchD_00103c61_caseD_42;
      }
      break;
    case 0x42:
switchD_00103c61_caseD_42:
      *direction = DOWN;
      if (input_direction < 'a') {
        if (input_direction == 'C') goto switchD_00103c61_caseD_43;
        if (input_direction != 'D') {
          return;
        }
      }
      else {
        if (input_direction == 'd') goto switchD_00103c61_caseD_43;
        if (input_direction != 'a') {
          return;
        }
      }
      break;
    case 0x43:
      goto switchD_00103c61_caseD_43;
    case 0x44:
      break;
    default:
      goto switchD_00103c61_default;
    }
  }
  else {
    if (0x72 < iVar2) {
      if (iVar2 != 0x73) {
        if (iVar2 != 0x77) {
          return;
        }
        goto switchD_00103c61_caseD_41;
      }
      goto switchD_00103c61_caseD_42;
    }
    if (iVar2 != 0x61) {
      if (iVar2 != 100) {
        return;
      }
      goto switchD_00103c61_caseD_43;
    }
  }
  *direction = LEFT;
  if ((input_direction != 'd') && (input_direction != 'C')) {
switchD_00103c61_default:
    return;
  }
switchD_00103c61_caseD_43:
  *direction = RIGHT;
  return;
}

Assistant:

void change_direction_move(Direction& direction, char input_direction)
{
    if(input_direction == KEY_UP or input_direction == 'w')
        direction = UP;

    if(input_direction == KEY_DOWN or input_direction == 's')
        direction = DOWN;

    if(input_direction == KEY_LEFT or input_direction == 'a')
        direction = LEFT;

    if(input_direction == KEY_RIGHT or input_direction == 'd')
        direction = RIGHT;
}